

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall ctemplate::Template::~Template(Template *this)

{
  HtmlParser *this_00;
  
  this->_vptr_Template = (_func_int **)&PTR__Template_001531d8;
  num_deletes_ = num_deletes_ + 1;
  if (this->tree_ != (SectionTemplateNode *)0x0) {
    (*(this->tree_->super_TemplateNode)._vptr_TemplateNode[1])();
  }
  if (this->template_text_ != (char *)0x0) {
    operator_delete__(this->template_text_);
  }
  this_00 = this->htmlparser_;
  if (this_00 != (HtmlParser *)0x0) {
    ctemplate_htmlparser::HtmlParser::~HtmlParser(this_00);
  }
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&this->resolved_filename_);
  std::__cxx11::string::~string((string *)&this->original_filename_);
  return;
}

Assistant:

Template::~Template() {
  VLOG(2) << endl << "Deleting Template for " << template_file()
          << "; with context " << initial_context_
          << "; and strip " << strip_ << endl;
  // Since this is only used by tests, we don't bother with locking
  num_deletes_++;
  delete tree_;
  // Delete this last, since tree has pointers into template_text_
  delete[] template_text_;
  delete htmlparser_;
}